

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::bytes_done(torrent *this,torrent_status *st,status_flags_t flags)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  element_type *peVar8;
  file_storage *pfVar9;
  pointer ppVar10;
  long *plVar11;
  pointer ppcVar12;
  pointer pdVar13;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_fd;
  int local_fc;
  long local_f8;
  int64_t additional_bytes;
  int local_e0;
  piece_index_t local_dc;
  const_iterator cStack_d8;
  piece_index_t index;
  __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_d0;
  const_iterator i;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  dl_queue;
  uint local_a4;
  piece_count local_a0;
  piece_count local_88;
  piece_count local_70;
  int64_t local_58;
  int64_t local_50;
  piece_count local_48;
  int64_t local_30;
  file_storage *local_28;
  file_storage *files;
  torrent_status *st_local;
  torrent *this_local;
  status_flags_t flags_local;
  
  st->total_done = 0;
  st->total_wanted_done = 0;
  st->total_wanted = (this->super_torrent_hot_members).m_size_on_disk;
  files = (file_storage *)st;
  st_local = (torrent_status *)this;
  this_local._4_4_ = flags.m_val;
  bVar3 = valid_metadata(this);
  if (bVar3) {
    if ((((byte)this->field_0x5cc >> 2 & 1) != 0) || (bVar3 = is_seed(this), bVar3)) {
      peVar8 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      iVar7 = torrent_info::total_size(peVar8);
      files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(iVar7 - this->m_padding_bytes);
      files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(this->super_torrent_hot_members).m_size_on_disk;
      files[1].m_symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(this->super_torrent_hot_members).m_size_on_disk;
    }
    else {
      bVar3 = has_picker(this);
      if (bVar3) {
        peVar8 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        pfVar9 = torrent_info::files(peVar8);
        local_28 = pfVar9;
        ppVar10 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        piece_picker::want(&local_48,ppVar10);
        local_30 = calc_bytes(pfVar9,&local_48);
        plVar11 = ::std::min<long>(&(this->super_torrent_hot_members).m_size_on_disk,&local_30);
        files[1].m_symlinks.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
        local_50 = aux::file_progress::total_on_disk(&this->m_file_progress);
        pfVar9 = local_28;
        ppVar10 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        piece_picker::have_want(&local_70,ppVar10);
        local_58 = calc_bytes(pfVar9,&local_70);
        plVar11 = ::std::min<long>(&local_50,&local_58);
        pfVar9 = local_28;
        files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
        ppVar10 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        piece_picker::have(&local_88,ppVar10);
        ppcVar12 = (pointer)calc_bytes(pfVar9,&local_88);
        pfVar9 = local_28;
        files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = ppcVar12;
        ppVar10 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        piece_picker::all_pieces(&local_a0,ppVar10);
        ppcVar12 = (pointer)calc_bytes(pfVar9,&local_a0);
        files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppcVar12;
        local_a4 = (uint)libtorrent::flags::operator&
                                   (this_local._4_4_,
                                    (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>
                                    )2);
        bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_a4);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          ppVar10 = ::std::
                    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                    ::operator->(&(this->super_torrent_hot_members).m_picker);
          piece_picker::get_download_queue
                    ((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                      *)&i,ppVar10);
          local_d0._M_current =
               (downloading_piece *)
               ::std::
               vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
               ::begin((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                        *)&i);
          while( true ) {
            cStack_d8 = ::std::
                        vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                        ::end((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                               *)&i);
            bVar3 = __gnu_cxx::operator!=(&local_d0,&stack0xffffffffffffff28);
            if (!bVar3) break;
            pdVar13 = __gnu_cxx::
                      __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                      ::operator->(&local_d0);
            local_dc.m_val = (pdVar13->index).m_val;
            ppVar10 = ::std::
                      unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ::operator->(&(this->super_torrent_hot_members).m_picker);
            local_e0 = local_dc.m_val;
            bVar3 = piece_picker::have_piece(ppVar10,local_dc);
            if (!bVar3) {
              pdVar13 = __gnu_cxx::
                        __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                        ::operator->(&local_d0);
              uVar2 = *(uint *)&pdVar13->field_0x6;
              pdVar13 = __gnu_cxx::
                        __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                        ::operator->(&local_d0);
              uVar1 = *(ushort *)&pdVar13->field_0x8;
              ppVar10 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              local_fc = local_dc.m_val;
              iVar4 = piece_picker::pad_bytes_in_piece(ppVar10,local_dc);
              iVar5 = block_size(this);
              iVar6 = block_size(this);
              local_f8 = (long)(int)(((uVar2 & 0x7fff) + (uVar1 & 0x7fff)) - iVar4 / iVar5) *
                         (long)iVar6;
              files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)files[1].m_file_hashes.
                                   super_vector<const_char_*,_std::allocator<const_char_*>_>.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start + local_f8);
              ppVar10 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              local_fd.m_val = (uchar)piece_picker::piece_priority(ppVar10,local_dc);
              bVar3 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::
                      operator>(&local_fd,
                                (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                 *)&dont_download);
              if (bVar3) {
                files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)(local_f8 +
                              (long)files[1].m_file_hashes.
                                    super_vector<const_char_*,_std::allocator<const_char_*>_>.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
            ::operator++(&local_d0);
          }
          ::std::
          vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
          ::~vector((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                     *)&i);
        }
      }
      else {
        files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        files[1].m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        files[1].m_symlinks.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(this->super_torrent_hot_members).m_size_on_disk;
      }
    }
  }
  return;
}

Assistant:

void torrent::bytes_done(torrent_status& st, status_flags_t const flags) const
	{
		INVARIANT_CHECK;

		st.total_done = 0;
		st.total_wanted_done = 0;
		st.total_wanted = m_size_on_disk;

		TORRENT_ASSERT(st.total_wanted <= m_torrent_file->total_size());
		TORRENT_ASSERT(st.total_wanted >= 0);

		TORRENT_ASSERT(!valid_metadata() || m_torrent_file->num_pieces() > 0);
		if (!valid_metadata()) return;

		if (m_seed_mode || is_seed())
		{
			// once we're a seed and remove the piece picker, we stop tracking
			// piece- and file priority. We consider everything as being
			// "wanted"
			st.total_done = m_torrent_file->total_size() - m_padding_bytes;
			st.total_wanted_done = m_size_on_disk;
			st.total_wanted = m_size_on_disk;
			TORRENT_ASSERT(st.total_wanted <= st.total_done);
			TORRENT_ASSERT(st.total_wanted_done <= st.total_wanted);
			TORRENT_ASSERT(st.total_done <= m_torrent_file->total_size());
			return;
		}
		else if (!has_picker())
		{
			st.total_done = 0;
			st.total_wanted_done = 0;
			st.total_wanted = m_size_on_disk;
			return;
		}

		TORRENT_ASSERT(has_picker());

		file_storage const& files = m_torrent_file->files();

		st.total_wanted = std::min(m_size_on_disk, calc_bytes(files, m_picker->want()));
		st.total_wanted_done = std::min(m_file_progress.total_on_disk()
			, calc_bytes(files, m_picker->have_want()));
		st.total_done = calc_bytes(files, m_picker->have());
		st.total = calc_bytes(files, m_picker->all_pieces());

		TORRENT_ASSERT(st.total_done <= calc_bytes(files, m_picker->all_pieces()));
		TORRENT_ASSERT(st.total_wanted <= calc_bytes(files, m_picker->all_pieces()));

		TORRENT_ASSERT(st.total_wanted_done >= 0);
		TORRENT_ASSERT(st.total_wanted >= 0);
		TORRENT_ASSERT(st.total_wanted >= st.total_wanted_done);
		TORRENT_ASSERT(st.total_done >= 0);
		TORRENT_ASSERT(st.total_done >= st.total_wanted_done);

		// this is expensive, we might not want to do it all the time
		if (!(flags & torrent_handle::query_accurate_download_counters)) return;

		// to get higher accuracy of the download progress, include
		// blocks from currently downloading pieces as well
		std::vector<piece_picker::downloading_piece> const dl_queue
			= m_picker->get_download_queue();

		// look at all unfinished pieces and add the completed
		// blocks to our 'done' counter
		for (auto i = dl_queue.begin(); i != dl_queue.end(); ++i)
		{
			piece_index_t const index = i->index;

			// completed pieces are already accounted for
			if (m_picker->have_piece(index)) continue;

			TORRENT_ASSERT(i->finished + i->writing <= m_picker->blocks_in_piece(index));

			auto const additional_bytes = std::int64_t(i->finished + i->writing
				- m_picker->pad_bytes_in_piece(index) / block_size())
				* block_size();
			TORRENT_ASSERT(additional_bytes >= 0);
			st.total_done += additional_bytes;
			if (m_picker->piece_priority(index) > dont_download)
				st.total_wanted_done += additional_bytes;
		}

		TORRENT_ASSERT(st.total_wanted_done >= 0);
		TORRENT_ASSERT(st.total_done >= st.total_wanted_done);
	}